

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_vmprintf(char *zFormat,__va_list_tag *ap)

{
  int iVar1;
  undefined1 local_98 [8];
  StrAccum acc;
  char zBase [70];
  char *z;
  __va_list_tag *ap_local;
  char *zFormat_local;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    sqlite3StrAccumInit((StrAccum *)local_98,(sqlite3 *)0x0,(char *)&acc.nChar,0x46,1000000000);
    sqlite3_str_vappendf((sqlite3_str *)local_98,zFormat,ap);
    zFormat_local = sqlite3StrAccumFinish((StrAccum *)local_98);
  }
  else {
    zFormat_local = (char *)0x0;
  }
  return zFormat_local;
}

Assistant:

SQLITE_API char *sqlite3_vmprintf(const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zFormat==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return 0;
#endif
  sqlite3StrAccumInit(&acc, 0, zBase, sizeof(zBase), SQLITE_MAX_LENGTH);
  sqlite3_str_vappendf(&acc, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  return z;
}